

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfadop.h
# Opt level: O1

value_type __thiscall
TFadBinaryDiv<TFad<6,_double>,_TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>_>
::dx(TFadBinaryDiv<TFad<6,_double>,_TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *pTVar8;
  TFad<6,_double> *pTVar9;
  TFad<6,_double> *pTVar10;
  TFad<6,_double> *pTVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pTVar8 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar12 = ((pTVar8->fadexpr_).left_)->val_ * ((pTVar8->fadexpr_).right_)->val_ +
           ((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_;
  dVar1 = this->left_->dx_[i];
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  pTVar9 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pTVar8 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  pTVar10 = (pTVar8->fadexpr_).left_;
  pTVar11 = (pTVar8->fadexpr_).right_;
  dVar2 = pTVar11->val_;
  dVar3 = pTVar10->val_;
  dVar4 = pTVar11->dx_[i];
  dVar5 = pTVar10->dx_[i];
  dVar6 = pTVar9->dx_[i];
  dVar13 = dVar2 * dVar3 + pTVar9->val_;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar7 = this->left_->val_;
  pTVar8 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar14 = ((pTVar8->fadexpr_).left_)->val_ * ((pTVar8->fadexpr_).right_)->val_ +
           ((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  pTVar8 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar15 = ((pTVar8->fadexpr_).left_)->val_ * ((pTVar8->fadexpr_).right_)->val_ +
           ((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  return (dVar1 * dVar12 - ((dVar5 * dVar2 + dVar4 * dVar3 + dVar6) / (dVar13 + dVar13)) * dVar7) /
         (dVar14 * dVar15);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}